

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

void ModifyDropAmount(AInventory *inv,int dropamount)

{
  bool bVar1;
  MetaClass *pMVar2;
  int local_24;
  double dStack_20;
  int amount;
  double dropammofactor;
  int flagmask;
  int dropamount_local;
  AInventory *inv_local;
  
  dropammofactor._0_4_ = 0x4000;
  dStack_20 = G_SkillProperty(SKILLP_DropAmmoFactor);
  if ((dStack_20 == -1.0) && (!NAN(dStack_20))) {
    dStack_20 = 0.5;
    dropammofactor._0_4_ = 0;
  }
  if (dropamount < 1) {
    bVar1 = DObject::IsKindOf((DObject *)inv,AAmmo::RegistrationInfo.MyClass);
    if (bVar1) {
      pMVar2 = AInventory::GetClass(inv);
      local_24 = *(int *)&pMVar2[1].super_PClassActor.super_PClass.super_PNativeStruct.super_PStruct
                          .super_PNamedType.super_PCompoundType.super_PType;
      if (local_24 < 1) {
        local_24 = MAX<int>(1,(int)((double)inv->Amount * dStack_20));
      }
      inv->Amount = local_24;
      inv->ItemFlags = dropammofactor._0_4_ | inv->ItemFlags;
    }
    else {
      bVar1 = DObject::IsKindOf((DObject *)inv,AWeaponGiver::RegistrationInfo.MyClass);
      if (bVar1) {
        inv[1].super_AActor.Angles.Pitch.Degrees = dStack_20;
        inv->ItemFlags = dropammofactor._0_4_ | inv->ItemFlags;
      }
      else {
        bVar1 = DObject::IsKindOf((DObject *)inv,AWeapon::RegistrationInfo.MyClass);
        if (bVar1) {
          *(int *)&inv[1].super_AActor.super_DThinker.super_DObject.ObjNext =
               (int)((double)*(int *)&inv[1].super_AActor.super_DThinker.super_DObject.ObjNext *
                    dStack_20);
          *(int *)((long)&inv[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4) =
               (int)((double)*(int *)((long)&inv[1].super_AActor.super_DThinker.super_DObject.
                                             ObjNext + 4) * dStack_20);
          inv->ItemFlags = dropammofactor._0_4_ | inv->ItemFlags;
        }
        else {
          bVar1 = DObject::IsKindOf((DObject *)inv,ADehackedPickup::RegistrationInfo.MyClass);
          if (bVar1) {
            *(undefined1 *)&inv[1].super_AActor.super_DThinker.super_DObject.Class = 1;
          }
        }
      }
    }
  }
  else if ((dropammofactor._0_4_ == 0) ||
          (bVar1 = DObject::IsKindOf((DObject *)inv,AAmmo::RegistrationInfo.MyClass), !bVar1)) {
    inv->Amount = dropamount;
  }
  else {
    inv->Amount = (int)((double)dropamount * dStack_20);
    inv->ItemFlags = inv->ItemFlags | 0x4000;
  }
  return;
}

Assistant:

void ModifyDropAmount(AInventory *inv, int dropamount)
{
	int flagmask = IF_IGNORESKILL;
	double dropammofactor = G_SkillProperty(SKILLP_DropAmmoFactor);
	// Default drop amount is half of regular amount * regular ammo multiplication
	if (dropammofactor == -1) 
	{
		dropammofactor = 0.5;
		flagmask = 0;
	}

	if (dropamount > 0)
	{
		if (flagmask != 0 && inv->IsKindOf(RUNTIME_CLASS(AAmmo)))
		{
			inv->Amount = int(dropamount * dropammofactor);
			inv->ItemFlags |= IF_IGNORESKILL;
		}
		else
		{
			inv->Amount = dropamount;
		}
	}
	else if (inv->IsKindOf (RUNTIME_CLASS(AAmmo)))
	{
		// Half ammo when dropped by bad guys.
		int amount = static_cast<PClassAmmo *>(inv->GetClass())->DropAmount;
		if (amount <= 0)
		{
			amount = MAX(1, int(inv->Amount * dropammofactor));
		}
		inv->Amount = amount;
		inv->ItemFlags |= flagmask;
	}
	else if (inv->IsKindOf (RUNTIME_CLASS(AWeaponGiver)))
	{
		static_cast<AWeaponGiver *>(inv)->DropAmmoFactor = dropammofactor;
		inv->ItemFlags |= flagmask;
	}
	else if (inv->IsKindOf (RUNTIME_CLASS(AWeapon)))
	{
		// The same goes for ammo from a weapon.
		static_cast<AWeapon *>(inv)->AmmoGive1 = int(static_cast<AWeapon *>(inv)->AmmoGive1 * dropammofactor);
		static_cast<AWeapon *>(inv)->AmmoGive2 = int(static_cast<AWeapon *>(inv)->AmmoGive2 * dropammofactor);
		inv->ItemFlags |= flagmask;
	}			
	else if (inv->IsKindOf (RUNTIME_CLASS(ADehackedPickup)))
	{
		// For weapons and ammo modified by Dehacked we need to flag the item.
		static_cast<ADehackedPickup *>(inv)->droppedbymonster = true;
	}
}